

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

void icu_63::number::impl::blueprint_helpers::parseIntegerWidthOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  unkbyte9 Var1;
  char16_t cVar2;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  int minInt;
  uint uVar6;
  uint index;
  int iVar7;
  IntegerWidth IVar8;
  anon_union_8_2_136a0349_for_fUnion local_40;
  undefined1 local_38;
  
  cVar2 = numparse::impl::StringSegment::charAt(segment,0);
  index = (uint)(cVar2 == L'+');
  iVar7 = -index;
  iVar3 = numparse::impl::StringSegment::length(segment);
  uVar6 = (uint)(cVar2 == L'+');
  if ((int)index < iVar3) {
    do {
      index = uVar6;
      cVar2 = numparse::impl::StringSegment::charAt(segment,index);
      if (cVar2 != L'#') break;
      iVar7 = iVar7 + 1;
      index = index + 1;
      iVar3 = numparse::impl::StringSegment::length(segment);
      uVar6 = index;
    } while ((int)index < iVar3);
  }
  iVar3 = numparse::impl::StringSegment::length(segment);
  minInt = 0;
  uVar6 = index;
  if (((int)index < iVar3) &&
     (iVar3 = numparse::impl::StringSegment::length(segment), (int)index < iVar3)) {
    minInt = 0;
    do {
      uVar6 = minInt + index;
      cVar2 = numparse::impl::StringSegment::charAt(segment,uVar6);
      if (cVar2 != L'0') goto LAB_0026b8de;
      iVar5 = minInt + 1;
      iVar3 = numparse::impl::StringSegment::length(segment);
      iVar4 = minInt + index;
      minInt = iVar5;
    } while (iVar4 + 1 < iVar3);
    uVar6 = index + iVar5;
  }
LAB_0026b8de:
  iVar4 = minInt + iVar7;
  if (iVar7 == -1) {
    iVar4 = -1;
  }
  iVar3 = numparse::impl::StringSegment::length(segment);
  if ((int)uVar6 < iVar3) {
    *status = U_NUMBER_SKELETON_SYNTAX_ERROR;
  }
  else {
    if (iVar4 == -1) {
      IVar8 = IntegerWidth::zeroFillTo(minInt);
      Var1 = IVar8._0_9_;
    }
    else {
      IVar8 = IntegerWidth::zeroFillTo(minInt);
      local_40 = IVar8.fUnion;
      local_38 = IVar8.fHasError;
      IVar8 = IntegerWidth::truncateAt((IntegerWidth *)&local_40.minMaxInt,iVar4);
      Var1 = IVar8._0_9_;
    }
    (macros->integerWidth).fUnion = SUB98(Var1,0);
    (macros->integerWidth).fHasError = SUB91((unkuint9)Var1 >> 0x40,0);
  }
  return;
}

Assistant:

void blueprint_helpers::parseIntegerWidthOption(const StringSegment& segment, MacroProps& macros,
                                                UErrorCode& status) {
    int32_t offset = 0;
    int32_t minInt = 0;
    int32_t maxInt;
    if (segment.charAt(0) == u'+') {
        maxInt = -1;
        offset++;
    } else {
        maxInt = 0;
    }
    for (; offset < segment.length(); offset++) {
        if (segment.charAt(offset) == u'#') {
            maxInt++;
        } else {
            break;
        }
    }
    if (offset < segment.length()) {
        for (; offset < segment.length(); offset++) {
            if (segment.charAt(offset) == u'0') {
                minInt++;
            } else {
                break;
            }
        }
    }
    if (maxInt != -1) {
        maxInt += minInt;
    }
    if (offset < segment.length()) {
        // throw new SkeletonSyntaxException("Invalid integer width stem", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }
    // Use the public APIs to enforce bounds checking
    if (maxInt == -1) {
        macros.integerWidth = IntegerWidth::zeroFillTo(minInt);
    } else {
        macros.integerWidth = IntegerWidth::zeroFillTo(minInt).truncateAt(maxInt);
    }
}